

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::shaderexecutor::PackSnorm4x8CaseInstance::iterate
          (TestStatus *__return_storage_ptr__,PackSnorm4x8CaseInstance *this)

{
  pointer *this_00;
  value_type vVar1;
  deUint32 dVar2;
  deInt32 dVar3;
  int iVar4;
  size_type sVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  ShaderExecutor *pSVar8;
  reference pvVar9;
  float *pfVar10;
  reference pvVar11;
  float fVar12;
  int local_7f8;
  int local_7f4;
  allocator<char> local_7d1;
  string local_7d0;
  undefined4 local_7b0;
  allocator<char> local_7a9;
  string local_7a8;
  int local_784;
  MessageBuilder local_780;
  MessageBuilder local_600;
  Vector<int,_4> local_480;
  Hex<8UL> local_470;
  Hex<8UL> local_468;
  MessageBuilder local_460;
  int local_2e0;
  int local_2dc;
  int diff3;
  int diff2;
  int diff1;
  int diff0;
  deUint16 res3;
  deUint16 res2;
  deUint16 res1;
  deUint16 res0;
  deUint32 res;
  deUint32 ref;
  deUint16 ref3;
  deUint16 ref2;
  deUint16 ref1;
  deUint16 ref0;
  int valNdx;
  int numFailed;
  int maxPrints;
  int numValues;
  reference local_2a0;
  void *out;
  void *in;
  MessageBuilder local_288;
  Vector<float,_4> local_104;
  float local_f4;
  float local_f0;
  float w_1;
  float z_1;
  float y_1;
  float x_1;
  int ndx_1;
  float local_d0;
  float local_cc;
  float w;
  float z;
  float y;
  float x;
  int ndx;
  Vector<float,_4> local_ac;
  Vector<float,_4> local_9c;
  Vector<float,_4> local_8c [2];
  Vector<float,_4> local_6c;
  int local_5c;
  undefined1 local_58 [4];
  int maxDiff;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputs;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> inputs;
  Random rnd;
  PackSnorm4x8CaseInstance *this_local;
  
  dVar2 = deStringHash((this->super_ShaderPackingFunctionTestInstance).m_name);
  de::Random::Random((Random *)
                     &inputs.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,dVar2 ^ 0x42f2c0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  if (this->m_precision == PRECISION_HIGHP) {
    local_7f4 = 1;
  }
  else {
    if (this->m_precision == PRECISION_MEDIUMP) {
      local_7f8 = 1;
    }
    else {
      local_7f8 = 0;
      if (this->m_precision == PRECISION_LOWP) {
        local_7f8 = 2;
      }
    }
    local_7f4 = local_7f8;
  }
  local_5c = local_7f4;
  tcu::Vector<float,_4>::Vector(&local_6c,0.0,0.0,0.0,0.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_6c);
  tcu::Vector<float,_4>::Vector(local_8c,-1.0,1.0,-1.0,1.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_8c);
  tcu::Vector<float,_4>::Vector(&local_9c,0.5,-0.5,-0.5,0.5);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_9c);
  tcu::Vector<float,_4>::Vector(&local_ac,-1.5,1.5,-1.5,1.5);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_ac);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&x,0.25,-0.75,-0.25,0.75);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(value_type *)&x);
  for (y = 0.0; (int)y < 0xf; y = (float)((int)y + 1)) {
    fVar12 = de::Random::getFloat
                       ((Random *)
                        &inputs.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    z = fVar12 * 2.5 + -1.25;
    fVar12 = de::Random::getFloat
                       ((Random *)
                        &inputs.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    w = fVar12 * 2.5 + -1.25;
    fVar12 = de::Random::getFloat
                       ((Random *)
                        &inputs.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_cc = fVar12 * 2.5 + -1.25;
    fVar12 = de::Random::getFloat
                       ((Random *)
                        &inputs.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_d0 = fVar12 * 2.5 + -1.25;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&x_1,z,w,local_cc,local_d0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(value_type *)&x_1);
  }
  for (y_1 = 0.0; (int)y_1 < 0x50; y_1 = (float)((int)y_1 + 1)) {
    fVar12 = de::Random::getFloat
                       ((Random *)
                        &inputs.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    z_1 = fVar12 * 1e+06 + -500000.0;
    fVar12 = de::Random::getFloat
                       ((Random *)
                        &inputs.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    w_1 = fVar12 * 1e+06 + -500000.0;
    fVar12 = de::Random::getFloat
                       ((Random *)
                        &inputs.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_f0 = fVar12 * 1e+06 + -500000.0;
    fVar12 = de::Random::getFloat
                       ((Random *)
                        &inputs.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_f4 = fVar12 * 1e+06 + -500000.0;
    tcu::Vector<float,_4>::Vector(&local_104,z_1,w_1,local_f0,local_f4);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_104);
  }
  sVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                    ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                     &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,sVar5);
  pTVar6 = tcu::TestContext::getLog((this->super_ShaderPackingFunctionTestInstance).m_testCtx);
  tcu::TestLog::operator<<(&local_288,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_288,(char (*) [22])"Executing shader for ");
  in = (void *)std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                         ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(unsigned_long *)&in);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [14])" input values");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_288);
  this_00 = &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  out = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                  ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)this_00
                   ,0);
  local_2a0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,0);
  pSVar8 = de::details::
           UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           ::operator->(&(this->super_ShaderPackingFunctionTestInstance).m_executor.
                         super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
                       );
  sVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                    ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                     this_00);
  ::vk::Handle<(vk::HandleType)22>::Handle((Handle<(vk::HandleType)22> *)&maxPrints,0);
  (*pSVar8->_vptr_ShaderExecutor[2])(pSVar8,sVar5 & 0xffffffff,&out,&local_2a0,_maxPrints);
  sVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                    ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                     &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  numFailed = (int)sVar5;
  valNdx = 10;
  _ref1 = 0;
  for (_ref3 = 0; _ref3 < numFailed; _ref3 = _ref3 + 1) {
    pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(long)_ref3);
    pfVar10 = tcu::Vector<float,_4>::x(pvVar9);
    fVar12 = de::clamp<float>(*pfVar10,-1.0,1.0);
    dVar3 = deRoundFloatToInt32(fVar12 * 127.0);
    iVar4 = de::clamp<int>(dVar3,-0x80,0x7f);
    ref._2_2_ = (ushort)iVar4 & 0xff;
    pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(long)_ref3);
    pfVar10 = tcu::Vector<float,_4>::y(pvVar9);
    fVar12 = de::clamp<float>(*pfVar10,-1.0,1.0);
    dVar3 = deRoundFloatToInt32(fVar12 * 127.0);
    iVar4 = de::clamp<int>(dVar3,-0x80,0x7f);
    ref._0_2_ = (ushort)iVar4 & 0xff;
    pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(long)_ref3);
    pfVar10 = tcu::Vector<float,_4>::z(pvVar9);
    fVar12 = de::clamp<float>(*pfVar10,-1.0,1.0);
    dVar3 = deRoundFloatToInt32(fVar12 * 127.0);
    iVar4 = de::clamp<int>(dVar3,-0x80,0x7f);
    res._2_2_ = (ushort)iVar4 & 0xff;
    pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(long)_ref3);
    pfVar10 = tcu::Vector<float,_4>::w(pvVar9);
    fVar12 = de::clamp<float>(*pfVar10,-1.0,1.0);
    dVar3 = deRoundFloatToInt32(fVar12 * 127.0);
    iVar4 = de::clamp<int>(dVar3,-0x80,0x7f);
    res._0_2_ = (ushort)iVar4 & 0xff;
    _res1 = (uint)(ushort)res << 0x18 | (uint)res._2_2_ << 0x10 | (uint)(ushort)ref << 8 |
            (uint)ref._2_2_;
    pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,(long)_ref3
                        );
    vVar1 = *pvVar11;
    res3._0_1_ = (byte)vVar1;
    diff0._2_2_ = (ushort)(byte)res3;
    res3._1_1_ = (byte)(vVar1 >> 8);
    diff0._0_2_ = (ushort)res3._1_1_;
    res2._0_1_ = (byte)(vVar1 >> 0x10);
    diff1._2_2_ = (ushort)(byte)res2;
    res2._1_1_ = (byte)(vVar1 >> 0x18);
    diff1._0_2_ = (ushort)res2._1_1_;
    _res3 = vVar1;
    diff2 = de::abs<int>((uint)ref._2_2_ - (uint)diff0._2_2_);
    diff3 = de::abs<int>((uint)(ushort)ref - (uint)(ushort)diff0);
    local_2dc = de::abs<int>((uint)res._2_2_ - (uint)diff1._2_2_);
    local_2e0 = de::abs<int>((uint)(ushort)res - (uint)(ushort)diff1);
    if ((((local_5c < diff2) || (local_5c < diff3)) || (local_5c < local_2dc)) ||
       (local_5c < local_2e0)) {
      if (_ref1 < 10) {
        pTVar6 = tcu::TestContext::getLog((this->super_ShaderPackingFunctionTestInstance).m_testCtx)
        ;
        tcu::TestLog::operator<<(&local_460,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (&local_460,(char (*) [26])"ERROR: Mismatch in value ");
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&ref3);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [25])", expected packSnorm4x8(");
        pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)&outputs.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(long)_ref3);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,pvVar9);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [5])0x131b1b7);
        local_468 = tcu::toHex<unsigned_int>(_res1);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_468);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [7])0x1386d38);
        local_470 = tcu::toHex<unsigned_int>(_res3);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_470);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])"\n  diffs = ");
        tcu::Vector<int,_4>::Vector(&local_480,diff2,diff3,local_2dc,local_2e0);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_480);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [14])0x138a57e);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_5c);
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_460);
      }
      else if (_ref1 == 10) {
        pTVar6 = tcu::TestContext::getLog((this->super_ShaderPackingFunctionTestInstance).m_testCtx)
        ;
        tcu::TestLog::operator<<(&local_600,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<(&local_600,(char (*) [4])"...");
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_600);
      }
      _ref1 = _ref1 + 1;
    }
  }
  pTVar6 = tcu::TestContext::getLog((this->super_ShaderPackingFunctionTestInstance).m_testCtx);
  tcu::TestLog::operator<<(&local_780,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  local_784 = numFailed - _ref1;
  pMVar7 = tcu::MessageBuilder::operator<<(&local_780,&local_784);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [4])" / ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&numFailed);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [15])" values passed");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_780);
  if (_ref1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7a8,"Pass",&local_7a9);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_7a8);
    std::__cxx11::string::~string((string *)&local_7a8);
    std::allocator<char>::~allocator(&local_7a9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7d0,"Result comparison failed",&local_7d1);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_7d0);
    std::__cxx11::string::~string((string *)&local_7d0);
    std::allocator<char>::~allocator(&local_7d1);
  }
  local_7b0 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  de::Random::~Random((Random *)
                      &inputs.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		de::Random					rnd			(deStringHash(m_name) ^ 0x42f2c0);
		std::vector<tcu::Vec4>		inputs;
		std::vector<deUint32>		outputs;
		const int					maxDiff		= m_precision == glu::PRECISION_HIGHP	? 1	:		// Rounding only.
												  m_precision == glu::PRECISION_MEDIUMP	? 1	:		// (2^-10) * (2^7) + 1
												  m_precision == glu::PRECISION_LOWP	? 2	: 0;	// (2^-8) * (2^7) + 1

		// Special values to check.
		inputs.push_back(tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f));
		inputs.push_back(tcu::Vec4(-1.0f, 1.0f, -1.0f, 1.0f));
		inputs.push_back(tcu::Vec4(0.5f, -0.5f, -0.5f, 0.5f));
		inputs.push_back(tcu::Vec4(-1.5f, 1.5f, -1.5f, 1.5f));
		inputs.push_back(tcu::Vec4(0.25f, -0.75f, -0.25f, 0.75f));

		// Random values, mostly in range.
		for (int ndx = 0; ndx < 15; ndx++)
		{
			const float x = rnd.getFloat()*2.5f - 1.25f;
			const float y = rnd.getFloat()*2.5f - 1.25f;
			const float z = rnd.getFloat()*2.5f - 1.25f;
			const float w = rnd.getFloat()*2.5f - 1.25f;
			inputs.push_back(tcu::Vec4(x, y, z, w));
		}

		// Large random values.
		for (int ndx = 0; ndx < 80; ndx++)
		{
			const float x = rnd.getFloat()*1e6f - 0.5e6f;
			const float y = rnd.getFloat()*1e6f - 0.5e6f;
			const float z = rnd.getFloat()*1e6f - 0.5e6f;
			const float w = rnd.getFloat()*1e6f - 0.5e6f;
			inputs.push_back(tcu::Vec4(x, y, z, w));
		}

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < numValues; valNdx++)
			{
				const deUint16	ref0	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].x(), -1.0f, 1.0f) * 127.0f), -(1<<7), (1<<7)-1);
				const deUint16	ref1	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].y(), -1.0f, 1.0f) * 127.0f), -(1<<7), (1<<7)-1);
				const deUint16	ref2	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].z(), -1.0f, 1.0f) * 127.0f), -(1<<7), (1<<7)-1);
				const deUint16	ref3	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].w(), -1.0f, 1.0f) * 127.0f), -(1<<7), (1<<7)-1);
				const deUint32	ref		= (deUint32(ref3) << 24) | (deUint32(ref2) << 16) | (deUint32(ref1) << 8) | deUint32(ref0);
				const deUint32	res		= outputs[valNdx];
				const deUint16	res0	= (deUint8)(res & 0xff);
				const deUint16	res1	= (deUint8)((res >> 8) & 0xff);
				const deUint16	res2	= (deUint8)((res >> 16) & 0xff);
				const deUint16	res3	= (deUint8)((res >> 24) & 0xff);
				const int		diff0	= de::abs((int)ref0 - (int)res0);
				const int		diff1	= de::abs((int)ref1 - (int)res1);
				const int		diff2	= de::abs((int)ref2 - (int)res2);
				const int		diff3	= de::abs((int)ref3 - (int)res3);

				if (diff0 > maxDiff || diff1 > maxDiff || diff2 > maxDiff || diff3 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx
															   << ", expected packSnorm4x8(" << inputs[valNdx] << ") = " << tcu::toHex(ref)
															   << ", got " << tcu::toHex(res)
															   << "\n  diffs = " << tcu::IVec4(diff0, diff1, diff2, diff3) << ", max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			if (numFailed == 0)
				return tcu::TestStatus::pass("Pass");
			else
				return tcu::TestStatus::fail("Result comparison failed");

		}
	}